

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateVariableName(ExpressionTranslateContext *ctx,VariableData *variable)

{
  ScopeData *pSVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  InplaceStr name;
  InplaceStr local_20;
  
  local_20.begin = "this";
  local_20.end = "";
  bVar2 = InplaceStr::operator==(&variable->name->name,&local_20);
  if (bVar2) {
    Print(ctx,"__context");
  }
  else {
    pcVar4 = (variable->name->name).begin;
    if (*pcVar4 == '$') {
      Print(ctx,"__");
      pcVar3 = (variable->name->name).end;
      pcVar4 = (variable->name->name).begin + 1;
      if (pcVar3 < pcVar4) {
        __assert_fail("strEnd >= strBegin",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                      ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
      }
    }
    else {
      pcVar3 = (variable->name->name).end;
    }
    name.end = pcVar3;
    name.begin = pcVar4;
    PrintEscapedName(ctx,name);
    pSVar1 = variable->scope;
    if ((((pSVar1 != ctx->ctx->globalScope) && (pSVar1->ownerType == (TypeBase *)0x0)) &&
        (pSVar1->ownerFunction == (FunctionData *)0x0)) &&
       (pSVar1->ownerNamespace == (NamespaceData *)0x0)) {
      Print(ctx,"_%d",(ulong)variable->uniqueId);
    }
  }
  return;
}

Assistant:

void TranslateVariableName(ExpressionTranslateContext &ctx, VariableData *variable)
{
	if(variable->name->name == InplaceStr("this"))
	{
		Print(ctx, "__context");
	}
	else
	{
		if(*variable->name->name.begin == '$')
		{
			Print(ctx, "__");

			PrintEscapedName(ctx, InplaceStr(variable->name->name.begin + 1, variable->name->name.end));
		}
		else
		{
			PrintEscapedName(ctx, variable->name->name);
		}

		if(variable->scope != ctx.ctx.globalScope && !variable->scope->ownerType && !variable->scope->ownerFunction && !variable->scope->ownerNamespace)
			Print(ctx, "_%d", variable->uniqueId);
	}
}